

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount,qsizetype elementSize,qsizetype headerSize)

{
  long lVar1;
  CalculateGrowingBlockSizeResult CVar2;
  quint64 v;
  size_t sVar3;
  long in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  size_t fittedBytes;
  size_t morebytes;
  qsizetype bytes;
  CalculateGrowingBlockSizeResult result;
  qsizetype in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffb0;
  qsizetype in_stack_ffffffffffffffb8;
  size_t local_38;
  long local_18;
  long local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = -1;
  local_10 = -1;
  v = qCalculateBlockSize(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
  if (-1 < (long)v) {
    local_38 = qNextPowerOfTwo(v);
    if ((long)local_38 < 0) {
      local_38 = (local_38 - v >> 1) + v;
    }
    sVar3 = QtPrivate::expectedAllocSize(local_38,0x10);
    if (sVar3 != 0) {
      local_38 = sVar3;
    }
    local_10 = (long)(local_38 - in_RDX) / in_RSI;
    local_18 = local_10 * in_RSI + in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  CVar2.elementCount = local_10;
  CVar2.size = local_18;
  return CVar2;
}

Assistant:

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount, qsizetype elementSize, qsizetype headerSize) noexcept
{
    CalculateGrowingBlockSizeResult result = {
        qsizetype(-1), qsizetype(-1)
    };

    qsizetype bytes = qCalculateBlockSize(elementCount, elementSize, headerSize);
    if (bytes < 0)
        return result;

    size_t morebytes = static_cast<size_t>(qNextPowerOfTwo(quint64(bytes)));
    if (Q_UNLIKELY(qsizetype(morebytes) < 0)) {
        // grow by half the difference between bytes and morebytes
        // this slows the growth and avoids trying to allocate exactly
        // 2G of memory (on 32bit), something that many OSes can't deliver
        bytes += (morebytes - bytes) / 2;
    } else {
        bytes = qsizetype(morebytes);
    }
    size_t fittedBytes = QtPrivate::expectedAllocSize(bytes, alignof(std::max_align_t));
    if (fittedBytes != 0)
        bytes = fittedBytes;

    result.elementCount = (bytes - headerSize) / elementSize;
    result.size = result.elementCount * elementSize + headerSize;
    return result;
}